

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall deqp::sl::ShaderParser::~ShaderParser(ShaderParser *this)

{
  ShaderParser *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_curTokenStr);
  std::__cxx11::string::~string((string *)&this->m_input);
  return;
}

Assistant:

ShaderParser::~ShaderParser(void)
{
	// nada
}